

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

int archive_read_open1(archive *_a)

{
  archive_string_conv **ppaVar1;
  long lVar2;
  undefined8 *puVar3;
  size_t sVar4;
  code *pcVar5;
  void *pvVar6;
  archive_read_filter *filter;
  bool bVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  archive_string_conv **ppaVar12;
  size_t sVar13;
  char *fmt;
  int iVar14;
  long lVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  archive_read_filter_bidder *best_bidder;
  long lVar19;
  ssize_t avail;
  long local_38;
  
  iVar9 = __archive_check_magic(_a,0xdeb0c5,1,"archive_read_open");
  if (iVar9 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  if (_a[1].compression_name == (char *)0x0) {
    archive_set_error(_a,0x16,"No reader function provided to archive_read_open");
    goto LAB_004138fc;
  }
  if ((*(code **)&_a[1].compression_code != (code *)0x0) &&
     (iVar9 = (**(code **)&_a[1].compression_code)
                        (_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + 0x10)), iVar9 != 0))
  {
    if (_a[1].error_string.s == (char *)0x0) {
      return iVar9;
    }
    if ((int)_a[1].error_string.buffer_length == 0) {
      return iVar9;
    }
    lVar19 = 0x10;
    uVar17 = 0;
    do {
      (*(code *)_a[1].error_string.s)(_a,*(undefined8 *)(*(long *)&_a[1].current_codepage + lVar19))
      ;
      uVar17 = uVar17 + 1;
      lVar19 = lVar19 + 0x18;
    } while (uVar17 < (uint)_a[1].error_string.buffer_length);
    return iVar9;
  }
  pvVar11 = calloc(1,0xb0);
  if (pvVar11 == (void *)0x0) {
    return -0x1e;
  }
  *(undefined8 *)((long)pvVar11 + 8) = 0;
  *(undefined8 *)((long)pvVar11 + 0x10) = 0;
  *(archive **)((long)pvVar11 + 0x18) = _a;
  puVar3 = *(undefined8 **)&_a[1].current_codepage;
  *(undefined8 *)((long)pvVar11 + 0x50) = puVar3[2];
  *(code **)((long)pvVar11 + 0x20) = client_open_proxy;
  *(code **)((long)pvVar11 + 0x28) = client_read_proxy;
  *(code **)((long)pvVar11 + 0x30) = client_skip_proxy;
  *(code **)((long)pvVar11 + 0x38) = client_seek_proxy;
  *(code **)((long)pvVar11 + 0x40) = client_close_proxy;
  *(code **)((long)pvVar11 + 0x48) = client_switch_proxy;
  *(char **)((long)pvVar11 + 0x58) = "none";
  *(undefined4 *)((long)pvVar11 + 0x60) = 0;
  *puVar3 = 0;
  sVar4 = _a[6].error_string.length;
  if ((sVar4 == 0) || ((int)_a[6].error_string.buffer_length == 0)) {
    _a[6].error_string.length = (size_t)pvVar11;
    iVar9 = 0;
LAB_0041391d:
    lVar15 = 0;
    lVar19 = 0;
    iVar14 = 0;
    do {
      pcVar5 = *(code **)((long)&_a[1].read_data_offset + lVar15);
      if (pcVar5 != (code *)0x0) {
        lVar2 = (long)&_a[1].sconv + lVar15;
        iVar10 = (*pcVar5)(lVar2,_a[6].error_string.length);
        if (iVar14 < iVar10) {
          lVar19 = lVar2;
          iVar14 = iVar10;
        }
      }
      lVar15 = lVar15 + 0x30;
    } while ((int)lVar15 != 0x300);
    if (lVar19 == 0) {
      __archive_read_filter_ahead((archive_read_filter *)_a[6].error_string.length,1,&local_38);
      if (local_38 < 0) {
        __archive_read_close_filters((archive_read *)_a);
        iVar14 = -0x1e;
        bVar7 = true;
        pvVar11 = (void *)_a[6].error_string.length;
        while (pvVar11 != (void *)0x0) {
          pvVar6 = *(void **)((long)pvVar11 + 0x10);
          free(pvVar11);
          _a[6].error_string.length = (size_t)pvVar6;
          pvVar11 = pvVar6;
        }
      }
      else {
        sVar4 = _a[6].error_string.length;
        _a->compression_name = *(char **)(sVar4 + 0x58);
        _a->compression_code = *(int *)(sVar4 + 0x60);
        bVar7 = false;
        iVar14 = 0;
      }
    }
    else {
      pvVar11 = calloc(1,0xb0);
      iVar14 = -0x1e;
      bVar7 = true;
      if (pvVar11 != (void *)0x0) {
        *(long *)((long)pvVar11 + 8) = lVar19;
        *(archive **)((long)pvVar11 + 0x18) = _a;
        *(size_t *)((long)pvVar11 + 0x10) = _a[6].error_string.length;
        _a[6].error_string.length = (size_t)pvVar11;
        iVar10 = (**(code **)(lVar19 + 0x18))(pvVar11);
        if (iVar10 == 0) goto code_r0x004139ad;
        __archive_read_close_filters((archive_read *)_a);
        pvVar11 = (void *)_a[6].error_string.length;
        while (pvVar11 != (void *)0x0) {
          pvVar6 = *(void **)((long)pvVar11 + 0x10);
          free(pvVar11);
          _a[6].error_string.length = (size_t)pvVar6;
          pvVar11 = pvVar6;
        }
      }
    }
    goto LAB_00413a70;
  }
  do {
    sVar13 = sVar4;
    sVar4 = *(size_t *)(sVar13 + 0x10);
  } while (sVar4 != 0);
  *(void **)(sVar13 + 0x10) = pvVar11;
  iVar14 = 0;
  goto LAB_00413a79;
code_r0x004139ad:
  iVar9 = iVar9 + 1;
  if (iVar9 == 0x19) goto code_r0x004139b8;
  goto LAB_0041391d;
code_r0x004139b8:
  archive_set_error(_a,0x54,"Input requires too many filters for decoding");
LAB_00413a70:
  if (bVar7) goto LAB_004138fc;
LAB_00413a79:
  if (_a[0xf].error_string.length != 0) goto LAB_00413b5c;
  ppaVar1 = &_a[6].sconv;
  _a[0xf].error_string.length = (size_t)ppaVar1;
  uVar16 = 0;
  uVar18 = 0xffffffff;
  iVar9 = -1;
  ppaVar12 = ppaVar1;
  do {
    uVar8 = uVar18;
    iVar10 = iVar9;
    if (ppaVar12[2] != (archive_string_conv *)0x0) {
      iVar10 = (*(code *)ppaVar12[2])(_a);
      if (iVar10 == -0x1e) goto LAB_00413b3b;
      filter = (archive_read_filter *)_a[6].error_string.length;
      if (filter->position != 0) {
        __archive_read_filter_seek(filter,0,0);
      }
      uVar8 = uVar16;
      if (-1 < (int)uVar18 && iVar10 <= iVar9) {
        uVar8 = uVar18;
        iVar10 = iVar9;
      }
    }
    iVar9 = iVar10;
    uVar18 = uVar8;
    uVar16 = uVar16 + 1;
    ppaVar12 = (archive_string_conv **)(_a[0xf].error_string.length + 0x58);
    _a[0xf].error_string.length = (size_t)ppaVar12;
  } while (uVar16 != 0x10);
  if ((int)uVar18 < 0) {
    fmt = "No formats registered";
LAB_00413b2c:
    archive_set_error(_a,0x54,fmt);
LAB_00413b3b:
    uVar18 = 0xffffffe2;
  }
  else if (iVar9 < 1) {
    fmt = "Unrecognized archive format";
    goto LAB_00413b2c;
  }
  if ((int)uVar18 < 0) {
    __archive_read_close_filters((archive_read *)_a);
LAB_004138fc:
    _a->state = 0x8000;
    return -0x1e;
  }
  _a[0xf].error_string.length = (size_t)(ppaVar1 + (ulong)uVar18 * 0xb);
LAB_00413b5c:
  _a->state = 2;
  client_switch_proxy((archive_read_filter *)_a[6].error_string.length,0);
  return iVar14;
}

Assistant:

int
archive_read_open1(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_read_filter *filter, *tmp;
	int slot, e = ARCHIVE_OK;
	unsigned int i;

	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_NEW,
	    "archive_read_open");
	archive_clear_error(&a->archive);

	if (a->client.reader == NULL) {
		archive_set_error(&a->archive, EINVAL,
		    "No reader function provided to archive_read_open");
		a->archive.state = ARCHIVE_STATE_FATAL;
		return (ARCHIVE_FATAL);
	}

	/* Open data source. */
	if (a->client.opener != NULL) {
		e = (a->client.opener)(&a->archive, a->client.dataset[0].data);
		if (e != 0) {
			/* If the open failed, call the closer to clean up. */
			if (a->client.closer) {
				for (i = 0; i < a->client.nodes; i++)
					(a->client.closer)(&a->archive,
					    a->client.dataset[i].data);
			}
			return (e);
		}
	}

	filter = calloc(1, sizeof(*filter));
	if (filter == NULL)
		return (ARCHIVE_FATAL);
	filter->bidder = NULL;
	filter->upstream = NULL;
	filter->archive = a;
	filter->data = a->client.dataset[0].data;
	filter->open = client_open_proxy;
	filter->read = client_read_proxy;
	filter->skip = client_skip_proxy;
	filter->seek = client_seek_proxy;
	filter->close = client_close_proxy;
	filter->sswitch = client_switch_proxy;
	filter->name = "none";
	filter->code = ARCHIVE_FILTER_NONE;

	a->client.dataset[0].begin_position = 0;
	if (!a->filter || !a->bypass_filter_bidding)
	{
		a->filter = filter;
		/* Build out the input pipeline. */
		e = choose_filters(a);
		if (e < ARCHIVE_WARN) {
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
	}
	else
	{
		/* Need to add "NONE" type filter at the end of the filter chain */
		tmp = a->filter;
		while (tmp->upstream)
			tmp = tmp->upstream;
		tmp->upstream = filter;
	}

	if (!a->format)
	{
		slot = choose_format(a);
		if (slot < 0) {
			__archive_read_close_filters(a);
			a->archive.state = ARCHIVE_STATE_FATAL;
			return (ARCHIVE_FATAL);
		}
		a->format = &(a->formats[slot]);
	}

	a->archive.state = ARCHIVE_STATE_HEADER;

	/* Ensure libarchive starts from the first node in a multivolume set */
	client_switch_proxy(a->filter, 0);
	return (e);
}